

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group.cpp
# Opt level: O1

void __thiscall duckdb::RowGroup::InitializeAppend(RowGroup *this,RowGroupAppendState *append_state)

{
  pointer psVar1;
  pointer psVar2;
  _Head_base<0UL,_duckdb::ColumnAppendState_*,_false> __ptr_00;
  undefined1 auVar3 [16];
  ulong *puVar4;
  ColumnData *pCVar5;
  pointer *__ptr;
  ulong uVar6;
  pointer __p;
  long lVar7;
  ulong uVar8;
  storage_t c;
  ColumnAppendState *local_38;
  
  append_state->row_group = this;
  append_state->offset_in_row_group =
       (this->super_SegmentBase<duckdb::RowGroup>).count.super___atomic_base<unsigned_long>._M_i;
  psVar1 = (this->columns).
           super_vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
           .
           super__Vector_base<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  psVar2 = (this->columns).
           super_vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
           .
           super__Vector_base<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar8 = (long)psVar1 - (long)psVar2 >> 4;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar8;
  uVar6 = 0xffffffffffffffff;
  if (SUB168(auVar3 * ZEXT816(0x30),8) == 0) {
    uVar6 = SUB168(auVar3 * ZEXT816(0x30),0) | 8;
  }
  puVar4 = (ulong *)operator_new__(uVar6);
  *puVar4 = uVar8;
  if (psVar1 != psVar2) {
    switchD_0105b559::default
              ((ColumnAppendState *)(puVar4 + 1),0,((uVar8 * 0x30 - 0x30) / 0x30) * 0x30 + 0x30);
  }
  local_38 = (ColumnAppendState *)0x0;
  __ptr_00._M_head_impl =
       (append_state->states).
       super_unique_ptr<duckdb::ColumnAppendState[],_std::default_delete<duckdb::ColumnAppendState[]>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::ColumnAppendState,_std::default_delete<duckdb::ColumnAppendState[]>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ColumnAppendState_*,_std::default_delete<duckdb::ColumnAppendState[]>_>
       .super__Head_base<0UL,_duckdb::ColumnAppendState_*,_false>._M_head_impl;
  (append_state->states).
  super_unique_ptr<duckdb::ColumnAppendState[],_std::default_delete<duckdb::ColumnAppendState[]>_>.
  _M_t.
  super___uniq_ptr_impl<duckdb::ColumnAppendState,_std::default_delete<duckdb::ColumnAppendState[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::ColumnAppendState_*,_std::default_delete<duckdb::ColumnAppendState[]>_>
  .super__Head_base<0UL,_duckdb::ColumnAppendState_*,_false>._M_head_impl =
       (ColumnAppendState *)(puVar4 + 1);
  if (__ptr_00._M_head_impl != (ColumnAppendState *)0x0) {
    ::std::default_delete<duckdb::ColumnAppendState[]>::operator()
              ((default_delete<duckdb::ColumnAppendState[]> *)&append_state->states,
               __ptr_00._M_head_impl);
  }
  if (local_38 != (ColumnAppendState *)0x0) {
    ::std::default_delete<duckdb::ColumnAppendState[]>::operator()
              ((default_delete<duckdb::ColumnAppendState[]> *)&local_38,local_38);
  }
  if ((this->columns).
      super_vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
      .
      super__Vector_base<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->columns).
      super_vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
      .
      super__Vector_base<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar7 = 0;
    c = 0;
    do {
      pCVar5 = GetColumn(this,c);
      (*pCVar5->_vptr_ColumnData[0x11])
                (pCVar5,(long)(append_state->states).
                              super_unique_ptr<duckdb::ColumnAppendState[],_std::default_delete<duckdb::ColumnAppendState[]>_>
                              ._M_t.
                              super___uniq_ptr_impl<duckdb::ColumnAppendState,_std::default_delete<duckdb::ColumnAppendState[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_duckdb::ColumnAppendState_*,_std::default_delete<duckdb::ColumnAppendState[]>_>
                              .super__Head_base<0UL,_duckdb::ColumnAppendState_*,_false> + lVar7);
      c = c + 1;
      lVar7 = lVar7 + 0x30;
    } while (c < (ulong)((long)(this->columns).
                               super_vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                               .
                               super__Vector_base<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->columns).
                               super_vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                               .
                               super__Vector_base<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 4));
  }
  return;
}

Assistant:

void RowGroup::InitializeAppend(RowGroupAppendState &append_state) {
	append_state.row_group = this;
	append_state.offset_in_row_group = this->count;
	// for each column, initialize the append state
	append_state.states = make_unsafe_uniq_array<ColumnAppendState>(GetColumnCount());
	for (idx_t i = 0; i < GetColumnCount(); i++) {
		auto &col_data = GetColumn(i);
		col_data.InitializeAppend(append_state.states[i]);
	}
}